

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testKNNValidatorNoDistanceFunction(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *nnModel;
  NearestNeighborsIndex *this;
  ostream *poVar2;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  nnModel = CoreML::Specification::Model::mutable_knearestneighborsclassifier(&m1);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(nnModel);
  this = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(nnModel);
  CoreML::Specification::NearestNeighborsIndex::mutable_linearindex(this);
  CoreML::KNNValidatorTests::addDataPoints(nnModel);
  CoreML::KNNValidatorTests::addStringLabels(nnModel);
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x14d);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorNoDistanceFunction() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_linearindex();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}